

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

bool __thiscall QSqlTableModel::selectRow(QSqlTableModel *this,int row)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QSqlTableModelPrivate *pQVar4;
  QSqlDriver *pQVar5;
  ulong uVar6;
  int in_ESI;
  QSqlTableModel *in_RDI;
  long in_FS_OFFSET;
  int f;
  bool needsAddingToCache;
  bool exists;
  int table_sort_col;
  QSqlTableModelPrivate *d;
  QSqlRecord curValues;
  QSqlQuery q;
  QSqlRecord newValues;
  QString stmt;
  QString table_filter;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  int in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  QString *in_stack_fffffffffffffe18;
  QString *query;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 uVar7;
  int local_1b8;
  bool local_1b2;
  bool local_1b1;
  byte local_191;
  undefined1 local_190 [24];
  undefined1 local_178 [24];
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [24];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  QLatin1StringView local_e0;
  QLatin1StringView local_d0;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [28];
  int local_4c;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = in_ESI;
  pQVar4 = d_func((QSqlTableModel *)0x16caf7);
  uVar7 = true;
  if (-1 < local_4c) {
    in_stack_fffffffffffffe34 = local_4c;
    QModelIndex::QModelIndex((QModelIndex *)0x16cb24);
    iVar2 = (**(code **)(*(long *)&in_RDI->super_QSqlQueryModel + 0x78))(in_RDI,local_68);
    uVar7 = iVar2 <= in_stack_fffffffffffffe34;
  }
  if ((bool)uVar7 == false) {
    iVar2 = pQVar4->sortColumn;
    pQVar4->sortColumn = -1;
    local_80 = 0xaaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaaaaaaaaaa;
    local_70 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                     (QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    pQVar5 = QSqlDatabase::driver(&pQVar4->db);
    query = &pQVar4->tableName;
    primaryValues(in_RDI,(int)((ulong)pQVar4 >> 0x20));
    (**(code **)(*(long *)pQVar5 + 0xa8))(local_98,pQVar5,0,query,local_a0);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                       (QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x16cc4c);
    QSqlRecord::~QSqlRecord((QSqlRecord *)0x16cc59);
    if ((selectRow(int)::wh == '\0') &&
       (iVar3 = __cxa_guard_acquire(&selectRow(int)::wh), iVar3 != 0)) {
      local_d0 = QSqlQueryModelSql::where();
      local_e0 = QSqlQueryModelSql::sp();
      ::operator+((QLatin1String *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                  (QLatin1String *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QLatin1String,_const_QLatin1String> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      __cxa_atexit(QString::~QString,&selectRow::wh,&__dso_handle);
      __cxa_guard_release(&selectRow(int)::wh);
    }
    uVar6 = QString::startsWith((QString *)&pQVar4->filter,0x19e070);
    if ((uVar6 & 1) != 0) {
      in_stack_fffffffffffffe18 = &pQVar4->filter;
      QString::size(&selectRow::wh);
      QString::remove((longlong)in_stack_fffffffffffffe18,0);
    }
    local_f8 = 0xaaaaaaaaaaaaaaaa;
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x16cd83);
    bVar1 = QString::isEmpty((QString *)0x16cd94);
    if (!bVar1) {
      (**(code **)(*(long *)&in_RDI->super_QSqlQueryModel + 0x1f8))(local_110);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                         (QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      QString::~QString((QString *)0x16cdd0);
    }
    pQVar4->sortColumn = iVar2;
    QString::operator=(&pQVar4->filter,(QString *)&local_80);
    iVar2 = (int)((ulong)pQVar4 >> 0x20);
    bVar1 = QString::isEmpty((QString *)0x16ce05);
    if (bVar1) {
      local_191 = 0;
    }
    else {
      local_1b1 = false;
      local_118 = 0xaaaaaaaaaaaaaaaa;
      QSqlRecord::QSqlRecord
                ((QSqlRecord *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      local_120 = 0xaaaaaaaaaaaaaaaa;
      QSqlQuery::QSqlQuery
                ((QSqlQuery *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (QSqlDatabase *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      QSqlQuery::setForwardOnly
                ((QSqlQuery *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 (bool)in_stack_fffffffffffffdff);
      bVar1 = QSqlQuery::exec((QSqlQuery *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),query);
      if (bVar1) {
        local_1b1 = QSqlQuery::next((QSqlQuery *)
                                    CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QSqlQuery::record((QSqlQuery *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                         );
        QSqlRecord::operator=
                  ((QSqlRecord *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (QSqlRecord *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        QSqlRecord::~QSqlRecord((QSqlRecord *)0x16ceea);
      }
      else {
        local_191 = 0;
      }
      QSqlQuery::~QSqlQuery
                ((QSqlQuery *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      if (bVar1) {
        iVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe14);
        if (local_1b1 != false) {
          bVar1 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::contains
                            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
                             CONCAT44(iVar3,in_stack_fffffffffffffe10),
                             (int *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          iVar3 = CONCAT13(bVar1,(int3)iVar3);
        }
        local_1b2 = SUB41((uint)iVar3 >> 0x18,0);
        if (local_1b2 == false) {
          local_130 = 0xaaaaaaaaaaaaaaaa;
          record((QSqlTableModel *)CONCAT17(uVar7,in_stack_fffffffffffffe40),iVar2);
          in_stack_fffffffffffffe10 = QSqlRecord::count((QSqlRecord *)0x16cf81);
          iVar2 = QSqlRecord::count((QSqlRecord *)0x16cf92);
          local_1b2 = in_stack_fffffffffffffe10 != iVar2;
          if (!local_1b2) {
            local_1b8 = QSqlRecord::count((QSqlRecord *)0x16cfbb);
            do {
              local_1b8 = local_1b8 + -1;
              if (local_1b8 < 0) goto LAB_0016d057;
              QSqlRecord::value((QSqlRecord *)in_stack_fffffffffffffe18,iVar3);
              QSqlRecord::value((QSqlRecord *)in_stack_fffffffffffffe18,iVar3);
              bVar1 = ::operator!=((QVariant *)
                                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                                   (QVariant *)
                                   CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
              in_stack_fffffffffffffe0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
              QVariant::~QVariant(&local_48);
              QVariant::~QVariant(&local_28);
            } while ((in_stack_fffffffffffffe0c & 0x1000000) == 0);
            local_1b2 = true;
          }
LAB_0016d057:
          QSqlRecord::~QSqlRecord((QSqlRecord *)0x16d064);
        }
        if (local_1b2 != false) {
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                    ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),(int *)query);
          QSqlTableModelPrivate::ModifiedRow::refresh
                    ((ModifiedRow *)CONCAT44(iVar3,in_stack_fffffffffffffe10),
                     SUB41(in_stack_fffffffffffffe0c >> 0x18,0),
                     (QSqlRecord *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,local_4c);
          QAbstractItemModel::createIndex
                    ((QAbstractItemModel *)CONCAT44(iVar3,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                     (void *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          QModelIndex::QModelIndex((QModelIndex *)0x16d0f6);
          (**(code **)(*(long *)&in_RDI->super_QSqlQueryModel + 0x80))(in_RDI,local_178);
          QAbstractItemModel::createIndex
                    ((QAbstractItemModel *)CONCAT44(iVar3,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c,local_4c,
                     (void *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          memset(local_190,0,0x18);
          QList<int>::QList((QList<int> *)0x16d147);
          QAbstractItemModel::dataChanged
                    ((QModelIndex *)in_RDI,(QModelIndex *)local_148,(QList_conflict *)local_160);
          QList<int>::~QList((QList<int> *)0x16d170);
        }
        local_191 = 1;
      }
      QSqlRecord::~QSqlRecord((QSqlRecord *)0x16d18a);
    }
    QString::~QString((QString *)0x16d197);
    QString::~QString((QString *)0x16d1a4);
  }
  else {
    local_191 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_191 & 1);
}

Assistant:

bool QSqlTableModel::selectRow(int row)
{
    Q_D(QSqlTableModel);

    if (row < 0 || row >= rowCount())
        return false;

    const int table_sort_col = d->sortColumn;
    d->sortColumn = -1;
    const QString table_filter = d->filter;
    d->filter = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                              d->tableName,
                                              primaryValues(row),
                                              false);
    static const QString wh = SqlTm::where() + SqlTm::sp();
    if (d->filter.startsWith(wh, Qt::CaseInsensitive))
        d->filter.remove(0, wh.size());

    QString stmt;

    if (!d->filter.isEmpty())
        stmt = selectStatement();

    d->sortColumn = table_sort_col;
    d->filter = table_filter;

    if (stmt.isEmpty())
        return false;

    bool exists;
    QSqlRecord newValues;

    {
        QSqlQuery q(d->db);
        q.setForwardOnly(true);
        if (!q.exec(stmt))
            return false;

        exists = q.next();
        newValues = q.record();
    }

    bool needsAddingToCache = !exists || d->cache.contains(row);

    if (!needsAddingToCache) {
        const QSqlRecord curValues = record(row);
        needsAddingToCache = curValues.count() != newValues.count();
        if (!needsAddingToCache) {
            // Look for changed values. Primary key fields are customarily first
            // and probably change less often than other fields, so start at the end.
            for (int f = curValues.count() - 1; f >= 0; --f) {
                if (curValues.value(f) != newValues.value(f)) {
                    needsAddingToCache = true;
                    break;
                }
            }
        }
    }

    if (needsAddingToCache) {
        d->cache[row].refresh(exists, newValues);
        emit headerDataChanged(Qt::Vertical, row, row);
        emit dataChanged(createIndex(row, 0), createIndex(row, columnCount() - 1));
    }

    return true;
}